

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseIncrementOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  uint uVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  uint uVar5;
  char16_t *p;
  char *offset;
  bool bVar6;
  StringPiece n;
  IncrementPrecision local_1e0;
  Precision local_1c0;
  int32_t local_19c;
  undefined1 auStack_198 [4];
  int32_t fractionLength;
  PrecisionUnion local_190;
  UNumberFormatRoundingMode local_180;
  uint local_174;
  double dStack_170;
  int decimalOffset;
  double increment;
  undefined4 local_160;
  UErrorCode local_154;
  undefined1 local_150 [4];
  UErrorCode localStatus;
  DecimalQuantity dq;
  UnicodeString local_f0;
  ConstChar16Ptr local_b0;
  UnicodeString local_a8;
  UErrorCode local_64;
  undefined1 local_60 [4];
  UErrorCode conversionStatus;
  CharString buffer;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  buffer._56_8_ = status;
  CharString::CharString((CharString *)local_60);
  local_64 = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_f0,segment);
  p = UnicodeString::getBuffer(&local_f0);
  ConstChar16Ptr::ConstChar16Ptr(&local_b0,p);
  iVar4 = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_a8,'\0',&local_b0,iVar4);
  CharString::appendInvariantChars((CharString *)local_60,&local_a8,&local_64);
  UnicodeString::~UnicodeString(&local_a8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  if (local_64 == U_INVARIANT_CONVERSION_ERROR) {
    *(undefined4 *)buffer._56_8_ = 0x10113;
    dq.usingBytes = true;
    dq.explicitExactDouble = false;
    dq._74_2_ = 0;
  }
  else {
    UVar2 = ::U_FAILURE(local_64);
    if (UVar2 == '\0') {
      DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_150);
      local_154 = U_ZERO_ERROR;
      offset = CharString::data((CharString *)local_60);
      iVar4 = CharString::length((CharString *)local_60);
      StringPiece::StringPiece((StringPiece *)&increment,offset,iVar4);
      n._12_4_ = 0;
      n.ptr_ = (char *)increment;
      n.length_ = local_160;
      DecimalQuantity::setToDecNumber((DecimalQuantity *)local_150,n,&local_154);
      UVar2 = ::U_FAILURE(local_154);
      if (UVar2 == '\0') {
        dStack_170 = DecimalQuantity::toDouble((DecimalQuantity *)local_150);
        local_174 = 0;
        while( true ) {
          uVar1 = local_174;
          iVar4 = numparse::impl::StringSegment::length(segment);
          bVar6 = false;
          if ((int)uVar1 < iVar4) {
            cVar3 = numparse::impl::StringSegment::charAt(segment,local_174);
            bVar6 = cVar3 != L'.';
          }
          uVar1 = local_174;
          if (!bVar6) break;
          local_174 = local_174 + 1;
        }
        uVar5 = numparse::impl::StringSegment::length(segment);
        if (uVar1 == uVar5) {
          Precision::increment((IncrementPrecision *)auStack_198,dStack_170);
          (macros->precision).fType = (PrecisionType)auStack_198;
          *(int32_t *)&(macros->precision).field_0x4 = fractionLength;
          (macros->precision).fUnion.fracSig = local_190.fracSig;
          *(undefined8 *)((long)&(macros->precision).fUnion + 8) = local_190._8_8_;
          (macros->precision).fRoundingMode = local_180;
        }
        else {
          iVar4 = numparse::impl::StringSegment::length(segment);
          local_19c = ~local_174 + iVar4;
          Precision::increment(&local_1e0,dStack_170);
          IncrementPrecision::withMinFraction(&local_1c0,&local_1e0,local_19c);
          (macros->precision).fType = local_1c0.fType;
          *(undefined4 *)&(macros->precision).field_0x4 = local_1c0._4_4_;
          (macros->precision).fUnion.fracSig = local_1c0.fUnion.fracSig;
          *(undefined8 *)((long)&(macros->precision).fUnion + 8) = local_1c0.fUnion._8_8_;
          (macros->precision).fRoundingMode = local_1c0.fRoundingMode;
        }
        dq.usingBytes = false;
        dq.explicitExactDouble = false;
        dq._74_2_ = 0;
      }
      else {
        *(undefined4 *)buffer._56_8_ = 0x10113;
        dq.usingBytes = true;
        dq.explicitExactDouble = false;
        dq._74_2_ = 0;
      }
      DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_150);
    }
    else {
      *(UErrorCode *)buffer._56_8_ = local_64;
      dq.usingBytes = true;
      dq.explicitExactDouble = false;
      dq._74_2_ = 0;
    }
  }
  CharString::~CharString((CharString *)local_60);
  return;
}

Assistant:

void blueprint_helpers::parseIncrementOption(const StringSegment& segment, MacroProps& macros,
                                             UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    // Utilize DecimalQuantity/decNumber to parse this for us.
    DecimalQuantity dq;
    UErrorCode localStatus = U_ZERO_ERROR;
    dq.setToDecNumber({buffer.data(), buffer.length()}, localStatus);
    if (U_FAILURE(localStatus)) {
        // throw new SkeletonSyntaxException("Invalid rounding increment", segment, e);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    double increment = dq.toDouble();

    // We also need to figure out how many digits. Do a brute force string operation.
    int decimalOffset = 0;
    while (decimalOffset < segment.length() && segment.charAt(decimalOffset) != '.') {
        decimalOffset++;
    }
    if (decimalOffset == segment.length()) {
        macros.precision = Precision::increment(increment);
    } else {
        int32_t fractionLength = segment.length() - decimalOffset - 1;
        macros.precision = Precision::increment(increment).withMinFraction(fractionLength);
    }
}